

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  undefined1 *puVar1;
  uint64_t *hcode;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint64_t i;
  uint64_t uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  uint8_t *out_4;
  undefined1 *puVar35;
  uint8_t *out_1;
  undefined1 *puVar36;
  bool bVar37;
  ulong *local_90;
  
  puVar36 = (undefined1 *)0x0;
  if (nRaw == 0) goto LAB_0010f0a4;
  if (sparebytes != 0x1c001c || outsz < 0x14) {
    return 3;
  }
  puVar1 = (undefined1 *)((long)out + 0x14);
  puVar16 = (undefined1 *)(outsz + (long)out);
  lVar12 = (long)spare + 0x100010;
  uVar20 = 0;
  memset(spare,0,0x80008);
  do {
    plVar13 = (long *)((long)spare + (ulong)raw[uVar20] * 8);
    *plVar13 = *plVar13 + 1;
    uVar20 = uVar20 + 1;
  } while (nRaw != uVar20);
  hcode = (uint64_t *)((long)spare + 0x80008);
  uVar17 = 0xffffffff;
  do {
    uVar15 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar15;
  } while (*(long *)((long)spare + uVar17 * 8) == 0);
  if (uVar15 < 0x10001) {
    plVar13 = (long *)((long)spare + (ulong)uVar15 * 8);
    uVar19 = 0;
    uVar9 = 0;
    uVar18 = uVar17;
    do {
      *(int *)((long)spare + uVar18 * 4 + 0x180018) = (int)uVar18;
      if (*plVar13 != 0) {
        *(long **)(lVar12 + (ulong)uVar9 * 8) = plVar13;
        uVar9 = uVar9 + 1;
        uVar19 = uVar18 & 0xffffffff;
      }
      uVar18 = uVar18 + 1;
      plVar13 = plVar13 + 1;
    } while ((int)uVar18 != 0x10001);
    uVar33 = (int)uVar19 + 1;
    uVar18 = (ulong)uVar33;
    local_90 = (ulong *)((long)spare + uVar18 * 8);
    *local_90 = 1;
    *(ulong **)((long)spare + (ulong)uVar9 * 8 + 0x100010) = local_90;
    uVar9 = uVar9 + 1;
    if (uVar9 < 2) goto LAB_0010e6ba;
    uVar14 = (ulong)uVar9;
    uVar10 = uVar14 - 2 >> 1;
    uVar19 = uVar14 - 1;
    uVar24 = uVar10;
    do {
      puVar2 = *(ulong **)(lVar12 + uVar24 * 8);
      uVar32 = uVar24;
      while (uVar32 < uVar19 >> 1) {
        uVar22 = uVar32 * 2 + 2;
        puVar3 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100018);
        puVar4 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100020);
        uVar25 = uVar32 * 2 + 1;
        uVar5 = *puVar4;
        uVar29 = *puVar3;
        uVar28 = uVar22;
        if (uVar5 == uVar29) {
          uVar28 = uVar25;
        }
        if (puVar4 <= puVar3) {
          uVar28 = uVar22;
        }
        if (uVar5 <= uVar29) {
          uVar25 = uVar28;
        }
        *(undefined8 *)(lVar12 + uVar32 * 8) = *(undefined8 *)(lVar12 + uVar25 * 8);
        uVar32 = uVar25;
      }
      if (((uVar9 & 1) == 0) && (uVar32 == uVar10)) {
        *(undefined8 *)(lVar12 + uVar10 * 8) = *(undefined8 *)(lVar12 + uVar19 * 8);
        uVar32 = uVar19;
      }
      if (uVar24 < uVar32) {
        uVar22 = *puVar2;
        do {
          uVar25 = uVar32 - 1 >> 1;
          puVar3 = *(ulong **)(lVar12 + uVar25 * 8);
          if ((*puVar3 <= uVar22) && (puVar3 <= puVar2 || *puVar3 != uVar22)) break;
          *(ulong **)(lVar12 + uVar32 * 8) = puVar3;
          uVar32 = uVar25;
        } while (uVar24 < uVar25);
      }
      *(ulong **)(lVar12 + uVar32 * 8) = puVar2;
      bVar37 = uVar24 != 0;
      uVar24 = uVar24 - 1;
    } while (bVar37);
    memset(hcode,0,0x80008);
    do {
      lVar6 = *(long *)((long)spare + 0x100010);
      puVar2 = *(ulong **)((long)spare + uVar14 * 8 + 0x100008);
      *(long *)((long)spare + uVar14 * 8 + 0x100008) = lVar6;
      uVar24 = (long)spare + ((uVar14 * 8 + 0x100008) - lVar12);
      lVar23 = (long)uVar24 >> 3;
      uVar19 = lVar23 - 1;
      if (uVar19 < 2) {
        uVar22 = 0;
      }
      else {
        uVar10 = 0;
        do {
          uVar32 = uVar10 * 2 + 2;
          puVar3 = *(ulong **)((long)spare + uVar10 * 0x10 + 0x100018);
          puVar4 = *(ulong **)((long)spare + uVar10 * 0x10 + 0x100020);
          uVar22 = uVar10 * 2 + 1;
          uVar25 = *puVar4;
          uVar5 = *puVar3;
          uVar29 = uVar32;
          if (uVar25 == uVar5) {
            uVar29 = uVar22;
          }
          if (puVar4 <= puVar3) {
            uVar29 = uVar32;
          }
          if (uVar25 <= uVar5) {
            uVar22 = uVar29;
          }
          *(undefined8 *)(lVar12 + uVar10 * 8) = *(undefined8 *)(lVar12 + uVar22 * 8);
          uVar10 = uVar22;
        } while (uVar22 < uVar19 >> 1);
      }
      if (((uVar24 & 8) == 0) && (uVar22 == lVar23 - 2U >> 1)) {
        *(undefined8 *)(lVar12 + uVar22 * 8) =
             *(undefined8 *)((long)spare + uVar22 * 0x10 + 0x100018);
        uVar22 = uVar22 * 2 + 1;
LAB_0010e88c:
        uVar19 = *puVar2;
        do {
          uVar24 = uVar22 - 1;
          uVar10 = uVar24 >> 1;
          puVar3 = *(ulong **)(lVar12 + uVar10 * 8);
          if ((*puVar3 <= uVar19) && (puVar3 <= puVar2 || *puVar3 != uVar19)) goto LAB_0010e8d5;
          *(ulong **)(lVar12 + uVar22 * 8) = puVar3;
          uVar22 = uVar10;
        } while (1 < uVar24);
        uVar22 = 0;
      }
      else {
        if (uVar22 != 0) goto LAB_0010e88c;
        uVar22 = 0;
      }
LAB_0010e8d5:
      *(ulong **)((long)spare + uVar22 * 8 + 0x100010) = puVar2;
      uVar19 = uVar14 - 1;
      lVar7 = *(long *)((long)spare + 0x100010);
      lVar23 = lVar12 + uVar14 * 8;
      if (1 < uVar19) {
        puVar2 = *(ulong **)(lVar23 + -0x10);
        *(long *)(lVar23 + -0x10) = lVar7;
        uVar24 = (lVar23 + -0x10) - lVar12;
        lVar11 = (long)uVar24 >> 3;
        uVar10 = lVar11 - 1;
        if (uVar10 < 2) {
          uVar25 = 0;
        }
        else {
          uVar32 = 0;
          do {
            uVar22 = uVar32 * 2 + 2;
            puVar3 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100018);
            puVar4 = *(ulong **)((long)spare + uVar32 * 0x10 + 0x100020);
            uVar25 = uVar32 * 2 + 1;
            uVar5 = *puVar4;
            uVar29 = *puVar3;
            uVar28 = uVar22;
            if (uVar5 == uVar29) {
              uVar28 = uVar25;
            }
            if (puVar4 <= puVar3) {
              uVar28 = uVar22;
            }
            if (uVar5 <= uVar29) {
              uVar25 = uVar28;
            }
            *(undefined8 *)(lVar12 + uVar32 * 8) = *(undefined8 *)(lVar12 + uVar25 * 8);
            uVar32 = uVar25;
          } while (uVar25 < uVar10 >> 1);
        }
        if (((uVar24 & 8) == 0) && (uVar25 == lVar11 - 2U >> 1)) {
          *(undefined8 *)(lVar12 + uVar25 * 8) =
               *(undefined8 *)((long)spare + uVar25 * 0x10 + 0x100018);
          uVar25 = uVar25 * 2 + 1;
LAB_0010e9c3:
          uVar24 = *puVar2;
          do {
            uVar10 = uVar25 - 1;
            uVar32 = uVar10 >> 1;
            puVar3 = *(ulong **)(lVar12 + uVar32 * 8);
            if ((*puVar3 <= uVar24) && (puVar3 <= puVar2 || *puVar3 != uVar24)) goto LAB_0010e9ff;
            *(ulong **)(lVar12 + uVar25 * 8) = puVar3;
            uVar25 = uVar32;
          } while (1 < uVar10);
        }
        else if (uVar25 != 0) goto LAB_0010e9c3;
        uVar25 = 0;
LAB_0010e9ff:
        *(ulong **)(lVar12 + uVar25 * 8) = puVar2;
      }
      uVar24 = (ulong)(lVar6 - (long)spare) >> 3;
      uVar10 = (ulong)(lVar7 - (long)spare) >> 3;
      plVar13 = (long *)((long)spare + (uVar10 & 0xffffffff) * 8);
      *plVar13 = *plVar13 + *(long *)((long)spare + (uVar24 & 0xffffffff) * 8);
      puVar2 = *(ulong **)(lVar23 + -0x10);
      if (uVar14 - 2 != 0) {
        uVar32 = *puVar2;
        uVar14 = uVar14 - 2;
        do {
          uVar22 = uVar14 - 1;
          uVar25 = uVar22 >> 1;
          puVar3 = *(ulong **)(lVar12 + uVar25 * 8);
          if ((*puVar3 <= uVar32) && (puVar3 <= puVar2 || *puVar3 != uVar32)) goto LAB_0010ea6c;
          *(ulong **)(lVar12 + uVar14 * 8) = puVar3;
          uVar14 = uVar25;
        } while (1 < uVar22);
      }
      uVar14 = 0;
LAB_0010ea6c:
      *(ulong **)(lVar12 + uVar14 * 8) = puVar2;
      do {
        uVar26 = (uint)uVar10;
        uVar14 = uVar10 & 0xffffffff;
        plVar13 = (long *)((long)spare + uVar14 * 8 + 0x80008);
        *plVar13 = *plVar13 + 1;
        uVar9 = *(uint *)((long)spare + uVar14 * 4 + 0x180018);
        uVar10 = (ulong)uVar9;
      } while (uVar9 != uVar26);
      *(int *)((long)spare + uVar14 * 4 + 0x180018) = (int)uVar24;
      do {
        uVar26 = (uint)uVar24;
        plVar13 = (long *)((long)spare + (uVar24 & 0xffffffff) * 8 + 0x80008);
        *plVar13 = *plVar13 + 1;
        uVar9 = *(uint *)((long)spare + (uVar24 & 0xffffffff) * 4 + 0x180018);
        uVar24 = (ulong)uVar9;
      } while (uVar9 != uVar26);
      uVar14 = uVar19;
    } while (1 < uVar19);
  }
  else {
    local_90 = (ulong *)((long)spare + 8);
    *(undefined8 *)((long)spare + 8) = 1;
    *(ulong **)((long)spare + 0x100010) = local_90;
    uVar33 = 1;
    uVar18 = 1;
LAB_0010e6ba:
    memset(hcode,0,0x80008);
  }
  hufCanonicalCodeTable(hcode);
  memcpy(spare,hcode,0x80008);
  puVar36 = puVar1;
  if (uVar15 <= uVar33) {
    uVar19 = 0;
    uVar24 = 0;
    do {
      uVar9 = (uint)uVar17;
      uVar14 = *(ulong *)((long)spare + uVar17 * 8) & 0x3f;
      iVar27 = (int)uVar19;
      if (uVar9 < uVar33 && uVar14 == 0) {
        uVar19 = 1;
        while (uVar10 = uVar19, (*(byte *)((long)spare + uVar17 * 8 + 8) & 0x3f) == 0) {
          uVar17 = uVar17 + 1;
          uVar10 = uVar19 + 1;
          if ((uVar18 <= uVar17) || (bVar37 = 0x103 < uVar19, uVar19 = uVar10, bVar37)) break;
        }
        uVar9 = (uint)uVar17;
        if (uVar10 < 2) goto LAB_0010ebe9;
        if (uVar10 < 6) {
          uVar24 = uVar24 << 6 | uVar10 + 0x39;
          if (iVar27 < 2) {
            uVar19 = (ulong)(iVar27 + 6);
          }
          else {
            iVar31 = iVar27 + -2;
            iVar27 = iVar27 + 0xe;
            do {
              iVar34 = iVar27;
              if (puVar16 <= puVar36) {
                return 4;
              }
              *puVar36 = (char)(uVar24 >> ((byte)iVar31 & 0x3f));
              puVar36 = puVar36 + 1;
              iVar27 = iVar34 + -8;
              iVar31 = iVar31 + -8;
            } while (0xf < iVar27);
            uVar19 = (ulong)(iVar34 - 0x10);
          }
        }
        else {
          iVar31 = iVar27 + 6;
          uVar17 = uVar24 << 6 | 0x3f;
          if (1 < iVar27) {
            iVar27 = iVar27 + 0xe;
            do {
              iVar34 = iVar27;
              iVar31 = iVar31 + -8;
              if (puVar16 <= puVar36) {
                return 4;
              }
              *puVar36 = (char)(uVar17 >> ((byte)iVar31 & 0x3f));
              puVar36 = puVar36 + 1;
              iVar27 = iVar34 + -8;
            } while (0xf < iVar27);
            iVar31 = iVar34 + -0x10;
          }
          uVar24 = uVar17 << 8 | uVar10 - 6;
          uVar19 = (ulong)(iVar31 + 8);
          if (-1 < iVar31) {
            do {
              if (puVar16 <= puVar36) {
                return 4;
              }
              *puVar36 = (char)(uVar24 >> ((byte)iVar31 & 0x3f));
              puVar36 = puVar36 + 1;
              iVar27 = (int)uVar19;
              uVar19 = (ulong)(iVar27 - 8);
              iVar31 = iVar31 + -8;
            } while (0xf < iVar27);
          }
        }
      }
      else {
LAB_0010ebe9:
        uVar24 = uVar24 << 6 | uVar14;
        if (iVar27 < 2) {
          uVar19 = (ulong)(iVar27 + 6U);
        }
        else {
          uVar19 = (ulong)(iVar27 + 6U);
          do {
            if (puVar16 <= puVar36) {
              return 4;
            }
            uVar19 = uVar19 - 8;
            *puVar36 = (char)(uVar24 >> ((byte)uVar19 & 0x3f));
            puVar36 = puVar36 + 1;
          } while (7 < uVar19);
        }
      }
      uVar17 = (ulong)(uVar9 + 1);
    } while (uVar9 + 1 <= uVar33);
    if (0 < (int)uVar19) {
      if (puVar16 <= puVar36) {
        return 4;
      }
      *puVar36 = (char)(uVar24 << (8U - (char)uVar19 & 0x3f));
      puVar36 = puVar36 + 1;
    }
  }
  uVar8 = *raw;
  puVar35 = puVar36;
  if (nRaw == 1) {
    uVar17 = 0;
    iVar27 = 0;
    iVar34 = 0;
  }
  else {
    uVar20 = 1;
    iVar27 = 0;
    uVar17 = 0;
    iVar31 = 0;
    do {
      if (iVar31 < 0xff && uVar8 == raw[uVar20]) {
        iVar34 = iVar31 + 1;
      }
      else {
        uVar18 = *(ulong *)((long)spare + (ulong)uVar8 * 8);
        uVar19 = *local_90;
        uVar26 = (uint)uVar18 & 0x3f;
        uVar9 = (uint)uVar19 & 0x3f;
        if ((int)(uVar9 + uVar26 + 8) < (int)(uVar26 * iVar31)) {
          uVar17 = uVar17 << ((byte)uVar18 & 0x3f) | uVar18 >> 6;
          iVar27 = uVar26 + iVar27;
          iVar30 = iVar27;
          iVar34 = iVar27;
          if (7 < iVar27) {
            do {
              if (puVar16 <= puVar35) {
                return 4;
              }
              *puVar35 = (char)(uVar17 >> ((byte)(iVar30 + -8) & 0x3f));
              puVar35 = puVar35 + 1;
              iVar34 = iVar27 + -8;
              bVar37 = 0xf < iVar27;
              iVar27 = iVar34;
              iVar30 = iVar30 + -8;
            } while (bVar37);
          }
          uVar17 = uVar17 << ((byte)uVar19 & 0x3f) | uVar19 >> 6;
          iVar34 = iVar34 + uVar9;
          iVar27 = iVar34;
          iVar30 = iVar34;
          if (7 < iVar34) {
            do {
              if (puVar16 <= puVar35) {
                return 4;
              }
              *puVar35 = (char)(uVar17 >> ((byte)(iVar27 + -8) & 0x3f));
              puVar35 = puVar35 + 1;
              iVar30 = iVar34 + -8;
              bVar37 = 0xf < iVar34;
              iVar34 = iVar30;
              iVar27 = iVar27 + -8;
            } while (bVar37);
          }
          uVar17 = uVar17 << 8 | (long)iVar31;
          iVar27 = iVar30 + 8;
          iVar34 = 0;
          if (-1 < iVar30) {
            iVar31 = iVar30 + 0x10;
            do {
              iVar30 = iVar31;
              iVar27 = iVar27 + -8;
              if (puVar16 <= puVar35) {
                return 4;
              }
              *puVar35 = (char)(uVar17 >> ((byte)iVar27 & 0x3f));
              puVar35 = puVar35 + 1;
              iVar31 = iVar30 + -8;
            } while (0xf < iVar31);
            iVar27 = iVar30 + -0x10;
          }
        }
        else {
          iVar34 = 0;
          if (-1 < iVar31) {
            do {
              uVar17 = uVar17 << ((byte)uVar18 & 0x3f) | uVar18 >> 6;
              iVar27 = iVar27 + uVar26;
              iVar21 = iVar27;
              iVar30 = iVar27;
              if (7 < iVar27) {
                do {
                  if (puVar16 <= puVar35) {
                    return 4;
                  }
                  *puVar35 = (char)(uVar17 >> ((byte)(iVar30 + -8) & 0x3f));
                  puVar35 = puVar35 + 1;
                  iVar27 = iVar21 + -8;
                  bVar37 = 0xf < iVar21;
                  iVar21 = iVar27;
                  iVar30 = iVar30 + -8;
                } while (bVar37);
              }
              bVar37 = 0 < iVar31;
              iVar31 = iVar31 + -1;
            } while (bVar37);
          }
        }
      }
      uVar8 = raw[uVar20];
      uVar20 = uVar20 + 1;
      iVar31 = iVar34;
    } while (uVar20 != nRaw);
  }
  uVar18 = *(ulong *)((long)spare + (ulong)uVar8 * 8);
  uVar19 = *local_90;
  uVar26 = (uint)uVar18 & 0x3f;
  uVar9 = (uint)uVar19 & 0x3f;
  if ((int)(uVar26 + uVar9 + 8) < (int)(uVar26 * iVar34)) {
    uVar17 = uVar17 << ((byte)uVar18 & 0x3f) | uVar18 >> 6;
    iVar27 = uVar26 + iVar27;
    iVar30 = iVar27;
    iVar31 = iVar27;
    if (7 < iVar27) {
      do {
        if (puVar16 <= puVar35) {
          return 4;
        }
        *puVar35 = (char)(uVar17 >> ((byte)(iVar30 + -8) & 0x3f));
        puVar35 = puVar35 + 1;
        iVar31 = iVar27 + -8;
        bVar37 = 0xf < iVar27;
        iVar27 = iVar31;
        iVar30 = iVar30 + -8;
      } while (bVar37);
    }
    uVar17 = uVar17 << ((byte)uVar19 & 0x3f) | uVar19 >> 6;
    iVar31 = iVar31 + uVar9;
    iVar27 = iVar31;
    iVar30 = iVar31;
    if (7 < iVar31) {
      do {
        if (puVar16 <= puVar35) {
          return 4;
        }
        *puVar35 = (char)(uVar17 >> ((byte)(iVar27 + -8) & 0x3f));
        puVar35 = puVar35 + 1;
        iVar30 = iVar31 + -8;
        bVar37 = 0xf < iVar31;
        iVar31 = iVar30;
        iVar27 = iVar27 + -8;
      } while (bVar37);
    }
    uVar17 = uVar17 << 8 | (long)iVar34;
    iVar27 = iVar30 + 8;
    if (-1 < iVar30) {
      iVar31 = iVar30 + 0x10;
      do {
        iVar34 = iVar31;
        iVar27 = iVar27 + -8;
        if (puVar16 <= puVar35) {
          return 4;
        }
        *puVar35 = (char)(uVar17 >> ((byte)iVar27 & 0x3f));
        puVar35 = puVar35 + 1;
        iVar31 = iVar34 + -8;
      } while (0xf < iVar31);
      iVar27 = iVar34 + -0x10;
    }
  }
  else if (-1 < iVar34) {
    do {
      uVar17 = uVar17 << ((byte)uVar18 & 0x3f) | uVar18 >> 6;
      iVar30 = iVar27 + uVar26;
      iVar31 = iVar30;
      iVar27 = iVar30;
      if (7 < iVar30) {
        do {
          if (puVar16 <= puVar35) {
            return 4;
          }
          *puVar35 = (char)(uVar17 >> ((byte)(iVar31 + -8) & 0x3f));
          puVar35 = puVar35 + 1;
          iVar27 = iVar30 + -8;
          bVar37 = 0xf < iVar30;
          iVar30 = iVar27;
          iVar31 = iVar31 + -8;
        } while (bVar37);
      }
      bVar37 = 0 < iVar34;
      iVar34 = iVar34 + -1;
    } while (bVar37);
  }
  if (iVar27 != 0) {
    if (puVar16 <= puVar35) {
      return 4;
    }
    *puVar35 = (char)(uVar17 << (8U - (char)iVar27 & 0x3f));
  }
  *(char *)out = (char)uVar15;
  *(char *)((long)out + 1) = (char)(uVar15 >> 8);
  *(char *)((long)out + 2) = (char)(uVar15 >> 0x10);
  *(char *)((long)out + 3) = (char)(uVar15 >> 0x18);
  iVar34 = (int)puVar35 - (int)puVar36;
  *(char *)((long)out + 4) = (char)uVar33;
  *(char *)((long)out + 5) = (char)(uVar33 >> 8);
  *(char *)((long)out + 6) = (char)(uVar33 >> 0x10);
  *(char *)((long)out + 7) = (char)(uVar33 >> 0x18);
  lVar12 = (long)puVar36 - (long)puVar1;
  *(char *)((long)out + 8) = (char)lVar12;
  *(char *)((long)out + 9) = (char)((ulong)lVar12 >> 8);
  *(char *)((long)out + 10) = (char)((ulong)lVar12 >> 0x10);
  *(char *)((long)out + 0xb) = (char)((ulong)lVar12 >> 0x18);
  iVar31 = iVar27 + iVar34 * 8;
  *(char *)((long)out + 0xc) = (char)iVar31;
  *(char *)((long)out + 0xd) = (char)((uint)iVar31 >> 8);
  *(char *)((long)out + 0xe) = (char)((uint)iVar31 >> 0x10);
  *(char *)((long)out + 0xf) = (char)((uint)iVar31 >> 0x18);
  puVar36 = puVar36 + ((ulong)(iVar27 + iVar34 * 8 + 7U >> 3) - (long)out);
  *(undefined4 *)((long)out + 0x10) = 0;
LAB_0010f0a4:
  *encbytes = (uint64_t)puVar36;
  return 0;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*  freq;
    uint32_t*  hlink;
    uint64_t** fHeap;
    uint64_t*  scode;
    uint32_t   im = 0;
    uint32_t   iM = 0;
    uint32_t   tableLength, nBits, dataLength;
    uint8_t*   dataStart;
    uint8_t*   compressed = (uint8_t*) out;
    uint8_t*   tableStart = compressed + 20;
    uint8_t*   tableEnd   = tableStart;
    uint8_t*   maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20)
        return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}